

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void DenseMatvec(DlsMat A,realtype *x,realtype *y)

{
  realtype **pprVar1;
  long lVar2;
  long lVar3;
  realtype *prVar4;
  long lVar5;
  long lVar6;
  
  pprVar1 = A->cols;
  lVar2 = A->M;
  lVar3 = A->N;
  if (0 < lVar2) {
    memset(y,0,lVar2 * 8);
  }
  if (0 < lVar3) {
    lVar5 = 0;
    do {
      if (0 < lVar2) {
        prVar4 = pprVar1[lVar5];
        lVar6 = 0;
        do {
          y[lVar6] = prVar4[lVar6] * x[lVar5] + y[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar3);
  }
  return;
}

Assistant:

void DenseMatvec(DlsMat A, realtype *x, realtype *y)
{
  denseMatvec(A->cols, x, y, A->M, A->N);
}